

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void asm_snap_prev(ASMState *as)

{
  uint uVar1;
  SnapShot *pSVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = as->curins;
  if (uVar1 < as->snapref) {
    lVar3 = (long)as->mctoporig - (long)as->mcp;
    if (0xffff < lVar3) {
      lj_trace_err(as->J,LJ_TRERR_MCODEOV);
    }
    uVar4 = (ulong)as->snapno;
    do {
      if (uVar4 == 0) {
        return;
      }
      uVar4 = uVar4 - 1;
      as->snapno = (SnapNo)uVar4;
      pSVar2 = as->T->snap;
      uVar5 = (uint)pSVar2[uVar4 & 0xffffffff].ref;
      as->snapref = uVar5;
      pSVar2[uVar4 & 0xffffffff].mcofs = (uint16_t)lVar3;
    } while (uVar1 < uVar5);
    as->snapalloc = 1;
  }
  return;
}

Assistant:

static void asm_snap_prev(ASMState *as)
{
  if (as->curins < as->snapref) {
    ptrdiff_t ofs = as->mctoporig - as->mcp;
    if (ofs >= 0x10000) lj_trace_err(as->J, LJ_TRERR_MCODEOV);
    do {
      if (as->snapno == 0) return;
      as->snapno--;
      as->snapref = as->T->snap[as->snapno].ref;
      as->T->snap[as->snapno].mcofs = ofs;  /* Remember mcode offset. */
    } while (as->curins < as->snapref);  /* May have no ins inbetween. */
    as->snapalloc = 1;
  }
}